

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::Dump
          (DictionaryTypeHandlerBase<unsigned_short> *this,uint indent)

{
  anon_class_24_3_dc8f6a89_for_fn fn;
  uint uVar1;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  **ppBVar2;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  uint local_2c;
  int local_28;
  uint mapValueIndent;
  uint mapLabelIndent;
  uint fieldIndent;
  char16_t *padding;
  DictionaryTypeHandlerBase<unsigned_short> *pDStack_10;
  uint indent_local;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  _mapLabelIndent = L"";
  mapValueIndent = indent + 2;
  local_28 = indent + 4;
  local_2c = indent + 6;
  padding._4_4_ = indent;
  pDStack_10 = this;
  Output::Print(L"%*sDictionaryTypeHandlerBase (0x%p):\n",(ulong)indent,L"");
  DynamicTypeHandler::Dump(&this->super_DynamicTypeHandler,padding._4_4_ + 2);
  ppBVar2 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                      ((WriteBarrierPtr *)&this->propertyMap);
  uVar1 = mapValueIndent;
  if (*ppBVar2 ==
      (BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
       *)0x0) {
    Output::Print(L"%*spropertyMap: <null>\n",(ulong)mapValueIndent,L"");
  }
  else {
    ppBVar2 = Memory::WriteBarrierPtr::operator_cast_to_BaseDictionary__
                        ((WriteBarrierPtr *)&this->propertyMap);
    Output::Print(L"%*spropertyMap: 0x%p\n",(ulong)uVar1,L"",*ppBVar2);
    this_00 = Memory::
              WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
              ::operator->(&this->propertyMap);
    fn.padding = (char16_t **)&mapLabelIndent;
    fn.mapLabelIndent = (uint *)&local_28;
    fn.mapValueIndent = &local_2c;
    JsUtil::
    BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
    ::
    Map<Js::DictionaryTypeHandlerBase<unsigned_short>::Dump(unsigned_int)const::_lambda(Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>const&)_1_>
              ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                *)this_00,fn);
  }
  Output::Print(L"%*snextPropertyIndex: %d\n",(ulong)mapValueIndent,L"",
                (ulong)this->nextPropertyIndex);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::Dump(unsigned indent) const {
        const auto padding(_u(""));
        const unsigned fieldIndent(indent + 2);
        const unsigned mapLabelIndent(indent + 4);
        const unsigned mapValueIndent(indent + 6);

        Output::Print(_u("%*sDictionaryTypeHandlerBase (0x%p):\n"), indent, padding, this);
        DynamicTypeHandler::Dump(indent + 2);
        if (this->propertyMap == nullptr)
        {
            Output::Print(_u("%*spropertyMap: <null>\n"), fieldIndent, padding);
        }
        else
        {
            Output::Print(_u("%*spropertyMap: 0x%p\n"), fieldIndent, padding, static_cast<void*>(this->propertyMap));
            this->propertyMap->Map([&](const PropertyRecord *key, const DictionaryPropertyDescriptor<T> &value)
            {
                Output::Print(_u("%*sKey:\n"), mapLabelIndent, padding);
                if (key == nullptr)
                {
                    Output::Print(_u("%*s<null>\n"), mapValueIndent, padding);
                }
                else
                {
                    key->Dump(mapValueIndent);
                }
                Output::Print(_u("%*sValue\n"), mapLabelIndent, padding);
                value.Dump(mapValueIndent);
            });
        }
        Output::Print(_u("%*snextPropertyIndex: %d\n"), fieldIndent, padding, static_cast<int32>(this->nextPropertyIndex));
    }